

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::ArrayInputStream::BackUp(ArrayInputStream *this,int count)

{
  int line;
  Nullable<const_char_*> failure_msg;
  Nonnull<const_char_*> failure_msg_00;
  LogMessage local_20;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl
                          (this->last_returned_size_,0,"last_returned_size_ > 0");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x47,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_20,(char (*) [55])"BackUp() can only be called after a successful Next().");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  failure_msg_00 =
       absl::lts_20250127::log_internal::Check_LEImpl
                 (count,this->last_returned_size_,"count <= last_returned_size_");
  if (failure_msg_00 == (Nullable<const_char_*>)0x0) {
    failure_msg_00 = absl::lts_20250127::log_internal::Check_GEImpl(count,0,"count >= 0");
    if (failure_msg_00 == (Nullable<const_char_*>)0x0) {
      this->position_ = this->position_ - count;
      this->last_returned_size_ = 0;
      return;
    }
    line = 0x4a;
  }
  else {
    line = 0x49;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,line,failure_msg_00);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void ArrayInputStream::BackUp(int count) {
  ABSL_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  ABSL_CHECK_LE(count, last_returned_size_);
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}